

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O1

REF_STATUS ref_math_normalize(REF_DBL *normal)

{
  REF_STATUS RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = normal[2] * normal[2] + *normal * *normal + normal[1] * normal[1];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar6 = dVar2 * 1e+20;
  if (dVar6 <= -dVar6) {
    dVar6 = -dVar6;
  }
  dVar3 = *normal;
  dVar5 = dVar3;
  if (dVar3 <= -dVar3) {
    dVar5 = -dVar3;
  }
  RVar1 = 4;
  if (dVar5 < dVar6) {
    dVar5 = normal[1];
    dVar4 = dVar5;
    if (dVar5 <= -dVar5) {
      dVar4 = -dVar5;
    }
    if (dVar4 < dVar6) {
      dVar4 = normal[2];
      dVar7 = dVar4;
      if (dVar4 <= -dVar4) {
        dVar7 = -dVar4;
      }
      if (dVar7 < dVar6) {
        dVar3 = dVar3 / dVar2;
        *normal = dVar3;
        dVar5 = dVar5 / dVar2;
        normal[1] = dVar5;
        dVar4 = dVar4 / dVar2;
        normal[2] = dVar4;
        dVar2 = dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + -1.0;
        if (dVar2 <= -dVar2) {
          dVar2 = -dVar2;
        }
        RVar1 = 0;
        if (1e-13 <= dVar2) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",
                 0x29,"ref_math_normalize","vector length not unity");
          RVar1 = 1;
        }
      }
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_math_normalize(REF_DBL *normal) {
  REF_DBL length;

  length = sqrt(ref_math_dot(normal, normal));

  if (!ref_math_divisible(normal[0], length) ||
      !ref_math_divisible(normal[1], length) ||
      !ref_math_divisible(normal[2], length))
    return REF_DIV_ZERO;

  normal[0] /= length;
  normal[1] /= length;
  normal[2] /= length;

  length = ref_math_dot(normal, normal);
  RAS((ABS(length - 1.0) < 1.0e-13), "vector length not unity");

  return REF_SUCCESS;
}